

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

function<void_(UdpSocket_*)> * __thiscall
SslUdpSocketImpl::BindFuncSslInitDone
          (function<void_(UdpSocket_*)> *__return_storage_ptr__,SslUdpSocketImpl *this,
          function<void_(UdpSocket_*)> *fSllInitDone)

{
  function<void_(UdpSocket_*)> *fSllInitDone_local;
  SslUdpSocketImpl *this_local;
  
  std::function<void_(UdpSocket_*)>::swap(&this->m_fSllInitDone,fSllInitDone);
  std::function<void_(UdpSocket_*)>::function(__return_storage_ptr__,fSllInitDone);
  return __return_storage_ptr__;
}

Assistant:

function<void(UdpSocket*)> SslUdpSocketImpl::BindFuncSslInitDone(function<void(UdpSocket*)> fSllInitDone) noexcept
{
    m_fSllInitDone.swap(fSllInitDone);
    return fSllInitDone;
}